

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  Vec3fa *pVVar1;
  HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::RecalculatePrimRef<embree::UserGeometry>,_2UL>
  *pHVar2;
  atomic<unsigned_long> *paVar3;
  pointer *pppTVar4;
  Split *pSVar5;
  float fVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  BBox1f BVar9;
  MemoryMonitorInterface *pMVar10;
  ThreadLocal2 *pTVar11;
  iterator iVar12;
  BBox1f *pBVar13;
  Scene *pSVar14;
  Geometry *pGVar15;
  int iVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  BBox1f BVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  vint *pvVar26;
  BBox1f BVar27;
  char cVar28;
  long lVar29;
  long lVar30;
  SetMB *this_00;
  long lVar31;
  void *pvVar32;
  ulong uVar33;
  float *pfVar34;
  size_t sVar35;
  undefined8 *puVar36;
  runtime_error *prVar37;
  int iVar38;
  BBox1f *pBVar39;
  ulong uVar40;
  uint *puVar41;
  byte bVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  char *pcVar46;
  BBox1f BVar47;
  int iVar48;
  ulong uVar49;
  BuildRecord *in_00;
  mvector<PrimRefMB> *prims;
  bool bVar50;
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar79;
  float fVar80;
  undefined1 auVar78 [16];
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar85;
  float fVar86;
  undefined1 auVar84 [16];
  float fVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar92;
  float fVar93;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
  *this_01;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1e58 [16];
  undefined1 local_1e38 [16];
  undefined1 local_1e18 [8];
  undefined8 uStack_1e10;
  undefined1 local_1df8 [16];
  undefined1 local_1de8 [16];
  BBox1f time_range1;
  BBox1f time_range0;
  PrimRefVector lprims;
  PrimInfoMB right;
  BBox<embree::Vec3fa> bi;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1cc8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aStack_1cb8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ca8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1c98;
  BBox1f local_1c88;
  BBox1f BStack_1c80;
  size_t sStack_1c78;
  size_t sStack_1c70;
  float local_1c68;
  float fStack_1c64;
  float fStack_1c60;
  float fStack_1c5c;
  anon_class_1_0_00000001 reduction;
  BBox<embree::Vec3fa> blower1;
  undefined1 auStack_1c08 [16];
  undefined1 local_1bf8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1be8;
  BBox1f local_1bd8;
  size_t sStack_1bd0;
  size_t sStack_1bc8;
  BBox1f BStack_1bc0;
  BBox1f local_1bb8;
  BBox1f BStack_1bb0;
  size_t sStack_1ba8;
  size_t sStack_1ba0;
  undefined1 auStack_1b98 [16];
  BBox1f local_1b88;
  BBox<embree::Vec3fa> bupper0;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  BBox1f local_1ac8;
  BBox1f BStack_1ac0;
  size_t sStack_1ab8;
  size_t sStack_1ab0;
  undefined1 auStack_1aa8 [16];
  BBox1f local_1a98;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_19f8 [16];
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18c8;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18a8;
  undefined8 local_1898;
  undefined8 uStack_1890;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1888;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1878;
  BBox1f local_1868;
  BBox1f BStack_1860;
  size_t sStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  BBox1f BStack_1840;
  BBox1f BStack_1838;
  undefined8 local_1828;
  undefined8 local_1818;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17e8;
  undefined1 local_17d8 [16];
  BBox<embree::Vec3fa> blower0;
  undefined1 local_17a8 [16];
  undefined1 auStack_1798 [16];
  undefined1 local_1788 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  undefined1 local_1768 [16];
  BBox1f local_1758 [2];
  size_t asStack_1748 [2];
  BBox1f local_1738;
  float fStack_1730;
  uint uStack_172c;
  BBox1f local_1728 [2];
  Split local_1718 [57];
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  BBox1f local_838 [63];
  long local_640;
  NodeRecordMB4D values [16];
  
  uVar33 = in->depth;
  if ((this->cfg).maxDepth < uVar33) {
    puVar36 = (undefined8 *)__cxa_allocate_exception(0x30);
    blower0.lower.field_0._0_8_ = &blower0.upper;
    std::__cxx11::string::_M_construct<char_const*>((string *)&blower0,"depth limit reached","");
    *puVar36 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar36 + 1) = 1;
    puVar36[2] = puVar36 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar36 + 2),blower0.lower.field_0._0_8_,
               CONCAT44(blower0.lower.field_0.m128[3],blower0.lower.field_0.m128[2]) +
               blower0.lower.field_0._0_8_);
    __cxa_throw(puVar36,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  aVar67 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds0.lower.field_0;
  uVar7 = *(undefined8 *)
           &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
            bounds0.upper.field_0;
  uVar17 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds0.upper.field_0 + 8);
  aVar56 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0;
  pVVar1 = &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
            bounds1.upper;
  uVar18 = *(undefined8 *)&pVVar1->field_0;
  uVar19 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds1.upper.field_0 + 8);
  local_1de8 = *(undefined1 (*) [16])(pVVar1->field_0).m128;
  aVar24 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           lower.field_0;
  aVar25 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           upper.field_0;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  BVar9 = (BBox1f)(in->prims).prims;
  BVar47 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._begin;
  BVar20 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._end;
  findFallback((Split *)&blower0,this,&in->prims);
  sStack_1858 = values[0].ref.ptr;
  uStack_1850 = values[0]._8_8_;
  uStack_1848 = values[0].lbounds.bounds0.lower.field_0._0_8_;
  BStack_1840.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  BStack_1840.upper = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar27 = BStack_1840;
  local_1828 = blower0.lower.field_0._0_8_;
  local_1818 = blower0.upper.field_0._0_8_;
  local_1808 = local_17a8._0_8_;
  uStack_1800 = local_17a8._8_8_;
  uStack_17f8 = auStack_1798._0_8_;
  uStack_17f0 = auStack_1798._8_8_;
  if ((uVar33 == 1) && (BVar20 != BVar47)) {
    BStack_1840.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    BStack_1840.upper = (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar29 = (long)BVar20 - (long)BVar47;
    if ((ulong)BVar20 < (ulong)BVar47 || lVar29 == 0) {
      auVar58 = ZEXT816(0xff8000007f800000);
    }
    else {
      pBVar39 = &(*(PrimRefMB **)((long)BVar9 + 0x20))[(long)BVar47].time_range;
      auVar58 = ZEXT816(0xff8000007f800000);
      do {
        auVar74._8_8_ = 0;
        auVar74._0_4_ = pBVar39->lower;
        auVar74._4_4_ = pBVar39->upper;
        auVar54 = vcmpps_avx(auVar58,auVar74,1);
        auVar53 = vinsertps_avx(auVar58,auVar74,0x50);
        auVar58 = vblendps_avx(auVar74,auVar58,2);
        auVar58 = vblendvps_avx(auVar58,auVar53,auVar54);
        pBVar39 = pBVar39 + 10;
        lVar29 = lVar29 + -1;
      } while (lVar29 != 0);
    }
    auVar54 = vmovshdup_avx(auVar58);
    auVar54 = vcmpps_avx(auVar54,ZEXT416((uint)BStack_1840.upper),1);
    auVar58 = vcmpps_avx(ZEXT416((uint)BStack_1840.lower),auVar58,1);
    auVar58 = vorps_avx(auVar58,auVar54);
    bVar42 = auVar58[0] & 1;
  }
  else {
    bVar42 = 0;
  }
  uVar40 = (long)BVar20 - (long)BVar47;
  local_18c8 = aVar67;
  local_18b8 = uVar7;
  uStack_18b0 = uVar17;
  local_18a8 = aVar56;
  local_1898 = uVar18;
  uStack_1890 = uVar19;
  local_1888 = aVar24;
  local_1878 = aVar25;
  local_1868 = BVar47;
  BStack_1860 = BVar20;
  BStack_1840 = BVar27;
  BStack_1838 = BVar9;
  if (((uVar40 <= (this->cfg).maxLeafSize) && ((uint)blower0.lower.field_0.m128[3] < 2)) &&
     (bVar42 == 0)) {
    bupper0.lower.field_0._0_8_ = uVar40 * 8;
    pTVar11 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar11->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar11;
      MutexSys::lock(&pTVar11->mutex);
      if ((pTVar11->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar3 = &((pTVar11->alloc)._M_b._M_p)->bytesUsed;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (pTVar11->alloc1).bytesUsed + (pTVar11->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar3 = &((pTVar11->alloc)._M_b._M_p)->bytesFree;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar11->alloc0).end + (pTVar11->alloc1).end) -
             ((pTVar11->alloc0).cur + (pTVar11->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar3 = &((pTVar11->alloc)._M_b._M_p)->bytesWasted;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (pTVar11->alloc1).bytesWasted + (pTVar11->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar61 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar11->alloc0).end = auVar61._0_8_;
      (pTVar11->alloc0).allocBlockSize = auVar61._8_8_;
      (pTVar11->alloc0).bytesUsed = auVar61._16_8_;
      (pTVar11->alloc0).bytesWasted = auVar61._24_8_;
      (pTVar11->alloc0).ptr = (char *)auVar61._0_8_;
      (pTVar11->alloc0).cur = auVar61._8_8_;
      (pTVar11->alloc0).end = auVar61._16_8_;
      (pTVar11->alloc0).allocBlockSize = auVar61._24_8_;
      auVar61 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar11->alloc1).end = auVar61._0_8_;
        (pTVar11->alloc1).allocBlockSize = auVar61._8_8_;
        (pTVar11->alloc1).bytesUsed = auVar61._16_8_;
        (pTVar11->alloc1).bytesWasted = auVar61._24_8_;
        (pTVar11->alloc1).ptr = (char *)auVar61._0_8_;
        (pTVar11->alloc1).cur = auVar61._8_8_;
        (pTVar11->alloc1).end = auVar61._16_8_;
        (pTVar11->alloc1).allocBlockSize = auVar61._24_8_;
      }
      else {
        (pTVar11->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar11->alloc1).ptr = (char *)auVar61._0_8_;
        (pTVar11->alloc1).cur = auVar61._8_8_;
        (pTVar11->alloc1).end = auVar61._16_8_;
        (pTVar11->alloc1).allocBlockSize = auVar61._24_8_;
        (pTVar11->alloc1).end = auVar61._0_8_;
        (pTVar11->alloc1).allocBlockSize = auVar61._8_8_;
        (pTVar11->alloc1).bytesUsed = auVar61._16_8_;
        (pTVar11->alloc1).bytesWasted = auVar61._24_8_;
        (pTVar11->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar11->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      blower0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      blower0.lower.field_0._8_1_ = 1;
      blower1.lower.field_0._0_8_ = pTVar11;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar12._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar12._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar12,(ThreadLocal2 **)&blower1);
      }
      else {
        *iVar12._M_current = (ThreadLocal2 *)blower1.lower.field_0._0_8_;
        pppTVar4 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar4 = *pppTVar4 + 1;
      }
      if (blower0.lower.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)blower0.lower.field_0._0_8_);
      }
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + bupper0.lower.field_0._0_8_;
    sVar35 = (alloc.talloc1)->cur;
    uVar33 = (ulong)(-(int)sVar35 & 0xf);
    uVar49 = sVar35 + bupper0.lower.field_0._0_8_ + uVar33;
    (alloc.talloc1)->cur = uVar49;
    if ((alloc.talloc1)->end < uVar49) {
      (alloc.talloc1)->cur = sVar35;
      if ((alloc.talloc1)->allocBlockSize < (ulong)(bupper0.lower.field_0._0_8_ << 2)) {
        pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&bupper0);
      }
      else {
        blower0.lower.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
        pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower0);
        (alloc.talloc1)->ptr = pcVar46;
        sVar35 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar35;
        (alloc.talloc1)->cur = 0;
        (alloc.talloc1)->end = blower0.lower.field_0._0_8_;
        (alloc.talloc1)->cur = bupper0.lower.field_0._0_8_;
        if ((ulong)blower0.lower.field_0._0_8_ < (ulong)bupper0.lower.field_0._0_8_) {
          (alloc.talloc1)->cur = 0;
          blower0.lower.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
          pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower0);
          (alloc.talloc1)->ptr = pcVar46;
          sVar35 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar35;
          (alloc.talloc1)->cur = 0;
          (alloc.talloc1)->end = blower0.lower.field_0._0_8_;
          (alloc.talloc1)->cur = bupper0.lower.field_0._0_8_;
          if ((ulong)blower0.lower.field_0._0_8_ < (ulong)bupper0.lower.field_0._0_8_) {
            (alloc.talloc1)->cur = 0;
            pcVar46 = (char *)0x0;
            goto LAB_0141b801;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar35;
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar33;
      pcVar46 = (alloc.talloc1)->ptr + (uVar49 - bupper0.lower.field_0._0_8_);
    }
LAB_0141b801:
    uVar33 = 7;
    if (uVar40 < 7) {
      uVar33 = uVar40;
    }
    if (BVar20 == BVar47) {
      local_17d8._8_4_ = 0xff800000;
      local_17d8._0_8_ = 0xff800000ff800000;
      local_17d8._12_4_ = 0xff800000;
      local_17e8.m128[2] = INFINITY;
      local_17e8._0_8_ = 0x7f8000007f800000;
      local_17e8.m128[3] = INFINITY;
      aVar56 = local_17e8;
      aVar67 = (anon_union_16_2_47237d3f_for_Vec3fa_0)local_17d8;
    }
    else {
      aVar56.m128[2] = INFINITY;
      aVar56._0_8_ = 0x7f8000007f800000;
      aVar56.m128[3] = INFINITY;
      aVar67.m128[2] = -INFINITY;
      aVar67._0_8_ = 0xff800000ff800000;
      aVar67.m128[3] = -INFINITY;
      uVar49 = 0;
      auVar58 = ZEXT816(0) << 0x40;
      local_17d8 = (undefined1  [16])aVar67;
      local_17e8 = aVar56;
      do {
        pSVar14 = ((this->createLeaf).bvh)->scene;
        auVar57._8_8_ = 0;
        auVar57._0_4_ = BStack_1840.lower;
        auVar57._4_4_ = BStack_1840.upper;
        fVar6 = (*(PrimRefMB **)((long)BStack_1838 + 0x20))[(long)BVar47].lbounds.bounds0.lower.
                field_0.m128[3];
        fVar81 = *(float *)((long)&(*(PrimRefMB **)((long)BStack_1838 + 0x20))[(long)BVar47].lbounds
                                   .bounds0.upper.field_0 + 0xc);
        *(float *)(pcVar46 + uVar49 * 8) = fVar6;
        *(float *)(pcVar46 + uVar49 * 8 + 4) = fVar81;
        pGVar15 = (pSVar14->geometries).items[(uint)fVar6].ptr;
        fVar6 = pGVar15->fnumTimeSegments;
        fVar79 = (pGVar15->time_range).lower;
        fVar51 = (pGVar15->time_range).upper - fVar79;
        fVar68 = (BStack_1840.lower - fVar79) / fVar51;
        auVar54 = vmovshdup_avx(auVar57);
        fVar51 = (auVar54._0_4_ - fVar79) / fVar51;
        fVar79 = fVar6 * fVar68;
        fVar80 = fVar6 * fVar51;
        auVar53 = vroundss_avx(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79),9);
        auVar74 = vroundss_avx(ZEXT416((uint)fVar80),ZEXT416((uint)fVar80),10);
        auVar58 = vmaxss_avx(auVar53,auVar58);
        auVar54 = vminss_avx(auVar74,ZEXT416((uint)fVar6));
        iVar38 = (int)auVar58._0_4_;
        fVar69 = auVar54._0_4_;
        iVar48 = (int)auVar53._0_4_;
        if ((int)auVar53._0_4_ < 0) {
          iVar48 = -1;
        }
        iVar16 = (int)fVar6 + 1;
        if ((int)auVar74._0_4_ < (int)fVar6 + 1) {
          iVar16 = (int)auVar74._0_4_;
        }
        values[0].ref.ptr = (size_t)pGVar15->userPtr;
        values[0].lbounds.bounds0.lower.field_0._0_8_ = &blower0;
        values[0]._8_4_ = fVar81;
        values[0]._12_4_ = iVar38;
        (**(code **)&pGVar15->field_0x58)(values);
        blower1.lower.field_0._0_8_ = pGVar15->userPtr;
        blower1.lower.field_0.m128[3] = (float)(int)fVar69;
        blower1.lower.field_0.m128[2] = fVar81;
        blower1.upper.field_0._0_8_ = values;
        (**(code **)&pGVar15->field_0x58)(&blower1);
        fVar79 = fVar79 - auVar58._0_4_;
        if (iVar16 - iVar48 == 1) {
          auVar58 = vmaxss_avx(ZEXT416((uint)fVar79),ZEXT816(0) << 0x40);
          auVar54 = vshufps_avx(auVar58,auVar58,0);
          auVar58 = ZEXT416((uint)(1.0 - auVar58._0_4_));
          auVar58 = vshufps_avx(auVar58,auVar58,0);
          auVar84._0_4_ =
               auVar54._0_4_ * (float)values[0].ref.ptr +
               auVar58._0_4_ * blower0.lower.field_0.m128[0];
          auVar84._4_4_ =
               auVar54._4_4_ * values[0].ref.ptr._4_4_ +
               auVar58._4_4_ * blower0.lower.field_0.m128[1];
          auVar84._8_4_ =
               auVar54._8_4_ * (float)values[0]._8_4_ +
               auVar58._8_4_ * blower0.lower.field_0.m128[2];
          auVar84._12_4_ =
               auVar54._12_4_ * (float)values[0]._12_4_ +
               auVar58._12_4_ * blower0.lower.field_0.m128[3];
          auVar91._0_4_ =
               auVar54._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._0_4_ +
               auVar58._0_4_ * blower0.upper.field_0._0_4_;
          auVar91._4_4_ =
               auVar54._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._4_4_ +
               auVar58._4_4_ * blower0.upper.field_0._4_4_;
          auVar91._8_4_ =
               auVar54._8_4_ * (float)values[0].lbounds.bounds0.lower.field_0._8_4_ +
               auVar58._8_4_ * blower0.upper.field_0._8_4_;
          auVar91._12_4_ =
               auVar54._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._12_4_ +
               auVar58._12_4_ * blower0.upper.field_0._12_4_;
          auVar58 = vmaxss_avx(ZEXT416((uint)(fVar69 - fVar80)),ZEXT816(0) << 0x40);
          auVar54 = vshufps_avx(auVar58,auVar58,0);
          auVar58 = ZEXT416((uint)(1.0 - auVar58._0_4_));
          auVar58 = vshufps_avx(auVar58,auVar58,0);
          auVar72._0_4_ =
               auVar58._0_4_ * (float)values[0].ref.ptr +
               auVar54._0_4_ * blower0.lower.field_0.m128[0];
          auVar72._4_4_ =
               auVar58._4_4_ * values[0].ref.ptr._4_4_ +
               auVar54._4_4_ * blower0.lower.field_0.m128[1];
          auVar72._8_4_ =
               auVar58._8_4_ * (float)values[0]._8_4_ +
               auVar54._8_4_ * blower0.lower.field_0.m128[2];
          auVar72._12_4_ =
               auVar58._12_4_ * (float)values[0]._12_4_ +
               auVar54._12_4_ * blower0.lower.field_0.m128[3];
          auVar78._0_4_ =
               auVar58._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._0_4_ +
               auVar54._0_4_ * blower0.upper.field_0._0_4_;
          auVar78._4_4_ =
               auVar58._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._4_4_ +
               auVar54._4_4_ * blower0.upper.field_0._4_4_;
          auVar78._8_4_ =
               auVar58._8_4_ * (float)values[0].lbounds.bounds0.lower.field_0._8_4_ +
               auVar54._8_4_ * blower0.upper.field_0._8_4_;
          auVar78._12_4_ =
               auVar58._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._12_4_ +
               auVar54._12_4_ * blower0.upper.field_0._12_4_;
          auVar58 = ZEXT416(0) << 0x20;
        }
        else {
          bupper0.lower.field_0.m128[3] = (float)(iVar38 + 1);
          bupper0.lower.field_0._0_8_ = pGVar15->userPtr;
          bupper0.lower.field_0._8_4_ = fVar81;
          bupper0.upper.field_0._0_8_ = &blower1;
          (**(code **)&pGVar15->field_0x58)(&bupper0);
          bi.lower.field_0.m128[3] = (float)((int)fVar69 + -1);
          bi.lower.field_0.m128[0] = SUB84(pGVar15->userPtr,0);
          bi.lower.field_0.m128[1] = (float)((ulong)pGVar15->userPtr >> 0x20);
          bi.lower.field_0._8_4_ = fVar81;
          bi.upper.field_0._0_8_ = &bupper0;
          (**(code **)&pGVar15->field_0x58)(&bi);
          auVar58 = vmaxss_avx(ZEXT416((uint)fVar79),ZEXT816(0) << 0x40);
          auVar54 = vshufps_avx(auVar58,auVar58,0);
          auVar58 = ZEXT416((uint)(1.0 - auVar58._0_4_));
          auVar58 = vshufps_avx(auVar58,auVar58,0);
          auVar84._0_4_ =
               auVar54._0_4_ * blower1.lower.field_0.m128[0] +
               auVar58._0_4_ * blower0.lower.field_0.m128[0];
          auVar84._4_4_ =
               auVar54._4_4_ * blower1.lower.field_0.m128[1] +
               auVar58._4_4_ * blower0.lower.field_0.m128[1];
          auVar84._8_4_ =
               auVar54._8_4_ * blower1.lower.field_0.m128[2] +
               auVar58._8_4_ * blower0.lower.field_0.m128[2];
          auVar84._12_4_ =
               auVar54._12_4_ * blower1.lower.field_0.m128[3] +
               auVar58._12_4_ * blower0.lower.field_0.m128[3];
          auVar91._0_4_ =
               auVar54._0_4_ * blower1.upper.field_0.m128[0] +
               auVar58._0_4_ * blower0.upper.field_0.m128[0];
          auVar91._4_4_ =
               auVar54._4_4_ * blower1.upper.field_0.m128[1] +
               auVar58._4_4_ * blower0.upper.field_0.m128[1];
          auVar91._8_4_ =
               auVar54._8_4_ * blower1.upper.field_0.m128[2] +
               auVar58._8_4_ * blower0.upper.field_0.m128[2];
          auVar91._12_4_ =
               auVar54._12_4_ * blower1.upper.field_0.m128[3] +
               auVar58._12_4_ * blower0.upper.field_0.m128[3];
          auVar58 = vmaxss_avx(ZEXT416((uint)(fVar69 - fVar80)),ZEXT816(0) << 0x40);
          auVar54 = vshufps_avx(auVar58,auVar58,0);
          auVar58 = ZEXT416((uint)(1.0 - auVar58._0_4_));
          auVar58 = vshufps_avx(auVar58,auVar58,0);
          auVar72._0_4_ =
               auVar54._0_4_ * bupper0.lower.field_0.m128[0] +
               auVar58._0_4_ * (float)values[0].ref.ptr;
          auVar72._4_4_ =
               auVar54._4_4_ * bupper0.lower.field_0.m128[1] +
               auVar58._4_4_ * values[0].ref.ptr._4_4_;
          auVar72._8_4_ =
               auVar54._8_4_ * bupper0.lower.field_0.m128[2] +
               auVar58._8_4_ * (float)values[0]._8_4_;
          auVar72._12_4_ =
               auVar54._12_4_ * bupper0.lower.field_0.m128[3] +
               auVar58._12_4_ * (float)values[0]._12_4_;
          auVar78._0_4_ =
               auVar54._0_4_ * bupper0.upper.field_0.m128[0] +
               auVar58._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
          auVar78._4_4_ =
               auVar54._4_4_ * bupper0.upper.field_0.m128[1] +
               auVar58._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
          auVar78._8_4_ =
               auVar54._8_4_ * bupper0.upper.field_0.m128[2] +
               auVar58._8_4_ * (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
          auVar78._12_4_ =
               auVar54._12_4_ * bupper0.upper.field_0.m128[3] +
               auVar58._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
          iVar48 = iVar48 + 1;
          if (iVar48 < iVar16) {
            do {
              auVar59._0_4_ = ((float)iVar48 / fVar6 - fVar68) / (fVar51 - fVar68);
              auVar59._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar58 = vshufps_avx(auVar59,auVar59,0);
              local_1e18._0_4_ = auVar72._0_4_;
              local_1e18._4_4_ = auVar72._4_4_;
              uStack_1e10._0_4_ = auVar72._8_4_;
              uStack_1e10._4_4_ = auVar72._12_4_;
              auVar54 = vshufps_avx(ZEXT416((uint)(1.0 - auVar59._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar59._0_4_)),0);
              fVar85 = auVar84._4_4_;
              fVar86 = auVar84._8_4_;
              fVar87 = auVar84._12_4_;
              auVar73._0_4_ =
                   auVar58._0_4_ * (float)local_1e18._0_4_ + auVar84._0_4_ * auVar54._0_4_;
              auVar73._4_4_ = auVar58._4_4_ * (float)local_1e18._4_4_ + fVar85 * auVar54._4_4_;
              auVar73._8_4_ = auVar58._8_4_ * (float)uStack_1e10 + fVar86 * auVar54._8_4_;
              auVar73._12_4_ = auVar58._12_4_ * uStack_1e10._4_4_ + fVar87 * auVar54._12_4_;
              fVar79 = auVar78._4_4_;
              fVar80 = auVar78._8_4_;
              fVar69 = auVar78._12_4_;
              fVar92 = auVar91._4_4_;
              fVar93 = auVar91._8_4_;
              fVar94 = auVar91._12_4_;
              auVar60._0_4_ = auVar78._0_4_ * auVar58._0_4_ + auVar91._0_4_ * auVar54._0_4_;
              auVar60._4_4_ = fVar79 * auVar58._4_4_ + fVar92 * auVar54._4_4_;
              auVar60._8_4_ = fVar80 * auVar58._8_4_ + fVar93 * auVar54._8_4_;
              auVar60._12_4_ = fVar69 * auVar58._12_4_ + fVar94 * auVar54._12_4_;
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              _0_8_ = pGVar15->userPtr;
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              m128[3] = (float)iVar48;
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              m128[2] = fVar81;
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
              _0_8_ = &bi;
              (**(code **)&pGVar15->field_0x58)(&right);
              auVar21._4_4_ = bi.lower.field_0.m128[1];
              auVar21._0_4_ = bi.lower.field_0.m128[0];
              auVar21._8_4_ = bi.lower.field_0.m128[2];
              auVar21._12_4_ = bi.lower.field_0.m128[3];
              auVar58 = vsubps_avx(auVar21,auVar73);
              auVar22._8_4_ = bi.upper.field_0.m128[2];
              auVar22._0_8_ = bi.upper.field_0._0_8_;
              auVar22._12_4_ = bi.upper.field_0.m128[3];
              auVar53 = vsubps_avx(auVar22,auVar60);
              auVar54 = vminps_avx(auVar58,ZEXT816(0) << 0x40);
              auVar58 = vmaxps_avx(auVar53,ZEXT816(0) << 0x40);
              auVar84._0_4_ = auVar84._0_4_ + auVar54._0_4_;
              auVar84._4_4_ = fVar85 + auVar54._4_4_;
              auVar84._8_4_ = fVar86 + auVar54._8_4_;
              auVar84._12_4_ = fVar87 + auVar54._12_4_;
              auVar72._0_4_ = (float)local_1e18._0_4_ + auVar54._0_4_;
              auVar72._4_4_ = (float)local_1e18._4_4_ + auVar54._4_4_;
              auVar72._8_4_ = (float)uStack_1e10 + auVar54._8_4_;
              auVar72._12_4_ = uStack_1e10._4_4_ + auVar54._12_4_;
              auVar91._0_4_ = auVar91._0_4_ + auVar58._0_4_;
              auVar91._4_4_ = fVar92 + auVar58._4_4_;
              auVar91._8_4_ = fVar93 + auVar58._8_4_;
              auVar91._12_4_ = fVar94 + auVar58._12_4_;
              auVar78._0_4_ = auVar78._0_4_ + auVar58._0_4_;
              auVar78._4_4_ = fVar79 + auVar58._4_4_;
              auVar78._8_4_ = fVar80 + auVar58._8_4_;
              auVar78._12_4_ = fVar69 + auVar58._12_4_;
              iVar48 = iVar48 + 1;
            } while (iVar16 != iVar48);
          }
          auVar58 = ZEXT816(0);
        }
        aVar67.m128 = (__m128)vmaxps_avx(aVar67.m128,auVar78);
        aVar56.m128 = (__m128)vminps_avx(aVar56.m128,auVar72);
        local_17d8 = vmaxps_avx(local_17d8,auVar91);
        local_17e8.m128 = (__m128)vminps_avx(local_17e8.m128,auVar84);
        BVar47 = (BBox1f)((long)BVar47 + 1);
        uVar49 = uVar49 + 1;
      } while (uVar49 != uVar40);
    }
    (__return_storage_ptr__->ref).ptr = uVar33 | (ulong)pcVar46 | 8;
    (__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_17e8;
    (__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)local_17d8;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0 = aVar56;
    (__return_storage_ptr__->lbounds).bounds1.upper.field_0 = aVar67;
    __return_storage_ptr__->dt = BStack_1840;
    return __return_storage_ptr__;
  }
  lVar29 = 0xbc;
  do {
    *(undefined8 *)(local_17d8 + lVar29 + 4) = 0xffffffff7f800000;
    *(undefined8 *)(local_17d8 + lVar29 + 0xc) = 0;
    lVar29 = lVar29 + 0xf0;
  } while (lVar29 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  local_1758[0] = BVar47;
  local_1758[1] = BVar20;
  asStack_1748[0] = values[0].ref.ptr;
  asStack_1748[1] = values[0]._8_8_;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  uStack_172c = values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = BVar9;
  local_1718[0].sah = (float)blower0.lower.field_0._0_4_;
  local_1718[0].dim = blower0.lower.field_0._4_4_;
  local_1718[0].mapping.num = blower0.upper.field_0._0_8_;
  local_1718[0].mapping.ofs.field_0._0_8_ = local_17a8._0_8_;
  local_1718[0].mapping.ofs.field_0._8_8_ = local_17a8._8_8_;
  local_1718[0].mapping.scale.field_0._0_8_ = auStack_1798._0_8_;
  local_1718[0].mapping.scale.field_0._8_8_ = auStack_1798._8_8_;
  local_840 = BVar9;
  local_838[0].lower = 2.8026e-45;
  local_838[0].upper = 0.0;
  local_8c8[0] = &local_840;
  pHVar2 = &this->heuristicTemporalSplit;
  uStack_1e10._0_4_ = INFINITY;
  local_1e18 = (undefined1  [8])0x7f8000007f800000;
  uStack_1e10._4_4_ = INFINITY;
  local_1df8._8_4_ = 0xff800000;
  local_1df8._0_8_ = 0xff800000ff800000;
  local_1df8._12_4_ = 0xff800000;
  uVar40 = 0;
  this_01 = this;
  blower0.lower.field_0._0_8_ = uVar33;
  blower0.upper.field_0 = aVar67;
  local_17a8._0_8_ = uVar7;
  local_17a8._8_8_ = uVar17;
  auStack_1798 = (undefined1  [16])aVar56;
  local_1788._0_8_ = uVar18;
  local_1788._8_8_ = uVar19;
  local_1778 = aVar24;
  local_1768 = (undefined1  [16])aVar25;
  do {
    if (local_848 == 0) {
      uVar49 = 0xffffffffffffffff;
    }
    else {
      uVar49 = 0xffffffffffffffff;
      pBVar39 = local_1758;
      uVar43 = 0;
      uVar44 = 0;
      do {
        uVar45 = (long)pBVar39[1] - (long)*pBVar39;
        if ((((this->cfg).maxLeafSize < uVar45) || (1 < (uint)pBVar39[9].upper)) || (bVar42 != 0)) {
          if (uVar43 < uVar45) {
            uVar49 = uVar44;
            uVar43 = uVar45;
          }
          bVar42 = 0;
        }
        uVar44 = uVar44 + 1;
        pBVar39 = pBVar39 + 0x1e;
      } while (local_848 != uVar44);
    }
    if (uVar49 != 0xffffffffffffffff) {
      lVar29 = uVar49 * 0xf0;
      blower1.lower.field_0._0_8_ = uVar33 + 1;
      pSVar5 = (Split *)((long)local_1718 + lVar29);
      iVar48 = *(int *)((long)local_1718 + lVar29 + 0xc);
      local_1de8._0_8_ = uVar40;
      bupper0.lower.field_0._0_8_ = blower1.lower.field_0._0_8_;
      if (iVar48 == 0) {
        local_1bb8 = local_1758[uVar49 * 0x1e];
        BStack_1ac0 = local_1758[uVar49 * 0x1e + 1];
        bi.lower.field_0.m128[0] = INFINITY;
        bi.lower.field_0.m128[1] = INFINITY;
        bi.lower.field_0.m128[2] = INFINITY;
        bi.lower.field_0.m128[3] = INFINITY;
        bi.upper.field_0.m128[0] = -INFINITY;
        bi.upper.field_0.m128[1] = -INFINITY;
        bi.upper.field_0.m128[2] = -INFINITY;
        bi.upper.field_0.m128[3] = -INFINITY;
        local_1cc8.i[0] = 0x7f800000;
        local_1cc8.i[1] = 0x7f800000;
        local_1cc8.i[2] = 0x7f800000;
        local_1cc8.i[3] = 0x7f800000;
        aStack_1cb8.i[0] = -0x800000;
        aStack_1cb8.i[1] = -0x800000;
        aStack_1cb8.i[2] = -0x800000;
        aStack_1cb8.i[3] = -0x800000;
        local_1ca8.m128[0] = INFINITY;
        local_1ca8.m128[1] = INFINITY;
        local_1ca8.m128[2] = INFINITY;
        local_1ca8.m128[3] = INFINITY;
        aStack_1c98.m128[0] = -INFINITY;
        aStack_1c98.m128[1] = -INFINITY;
        aStack_1c98.m128[2] = -INFINITY;
        aStack_1c98.m128[3] = -INFINITY;
        local_1c68 = 0.0;
        local_1c88.lower = 0.0;
        local_1c88.upper = 0.0;
        BStack_1c80.lower = 0.0;
        BStack_1c80.upper = 0.0;
        sStack_1c78 = 0;
        sStack_1c70 = 0;
        auVar75._8_4_ = 0x3f800000;
        auVar75._0_8_ = &DAT_3f8000003f800000;
        auVar75._12_4_ = 0x3f800000;
        lVar31 = vmovlps_avx(auVar75);
        fStack_1c64 = (float)lVar31;
        fStack_1c60 = (float)((ulong)lVar31 >> 0x20);
        fStack_1c5c = 0.0;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [0] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [1] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [2] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [3] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [0] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [1] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             -INFINITY;
        right.max_time_range.lower = 0.0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        uVar7 = vmovlps_avx(auVar75);
        right.max_time_range.upper = (float)uVar7;
        right.time_range.lower = (float)((ulong)uVar7 >> 0x20);
        right.time_range.upper = 0.0;
        vSplitPos.field_0.i[1] = *(undefined4 *)((long)local_1718 + lVar29 + 8);
        vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
        lVar30 = (long)(1 << (*(byte *)((long)local_1718 + lVar29 + 4) & 0x1f)) * 0x10;
        vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar30);
        vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar30 + 8);
        isLeft.vSplitPos = &vSplitPos;
        isLeft.vSplitMask = &vSplitMask;
        isLeft.split = pSVar5;
        BStack_1bb0 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                        (*(PrimRefMB **)((long)local_1728[uVar49 * 0x1e] + 0x20),
                                         (size_t)local_1bb8,(size_t)BStack_1ac0,
                                         (EmptyTy *)local_19f8,
                                         (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bi,&right,
                                         &isLeft,&reduction,&reduction2,0x80,0xc00);
        local_1b88 = local_1728[uVar49 * 0x1e];
        auVar52._8_8_ = 0;
        auVar52._0_4_ = local_1728[uVar49 * 0x1e + -1].lower;
        auVar52._4_4_ = local_1728[uVar49 * 0x1e + -1].upper;
        auStack_1c08._4_4_ = bi.upper.field_0.m128[1];
        auStack_1c08._0_4_ = bi.upper.field_0.m128[0];
        auStack_1c08._12_4_ = bi.upper.field_0.m128[3];
        auStack_1c08._8_4_ = bi.upper.field_0.m128[2];
        local_1bf8._0_4_ = INFINITY;
        local_1bf8._4_4_ = INFINITY;
        local_1bf8._8_4_ = INFINITY;
        local_1bf8._12_4_ = INFINITY;
        aStack_1be8.m128[0] = -INFINITY;
        aStack_1be8.m128[1] = -INFINITY;
        aStack_1be8.m128[2] = -INFINITY;
        aStack_1be8.m128[3] = -INFINITY;
        local_1bd8.lower = INFINITY;
        local_1bd8.upper = INFINITY;
        sStack_1bd0 = 0x7f8000007f800000;
        sStack_1bc8 = 0xff800000ff800000;
        BStack_1bc0.lower = -INFINITY;
        BStack_1bc0.upper = -INFINITY;
        blower1.upper.field_0.m128[0] = bi.lower.field_0.m128[0];
        blower1.upper.field_0.m128[1] = bi.lower.field_0.m128[1];
        blower1.upper.field_0.m128[2] = bi.lower.field_0.m128[2];
        blower1.upper.field_0.m128[3] = bi.lower.field_0.m128[3];
        sStack_1ba8 = 0;
        sStack_1ba0 = 0;
        auStack_1b98._0_8_ = lVar31 << 0x20;
        auStack_1b98._8_8_ = SUB168(auStack_1b98,8);
        auVar62._8_8_ = 0;
        auVar62._0_8_ = auStack_1b98._8_8_;
        auVar58 = vcmpps_avx(auVar62,auVar52,1);
        auVar54 = vinsertps_avx(auVar52,auVar62,0x50);
        auVar53 = vinsertps_avx(auVar62,auVar52,0x50);
        auVar58 = vblendvps_avx(auVar53,auVar54,auVar58);
        uVar7 = vmovlps_avx(auVar58);
        auStack_1b98._0_8_ = SUB168(auStack_1b98,0);
        auStack_1b98._8_8_ = uVar7;
        bupper0.upper.field_0._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        bupper0.upper.field_0._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        uStack_1b10 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds0.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds0.upper.field_0.m128[2]);
        uStack_1b18 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                      field_0._0_8_;
        local_1b08 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                              bounds1.lower.field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                              bounds1.lower.field_0.m128[0]);
        uStack_1b00 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.lower.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.lower.field_0.m128[2]);
        uStack_1af8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[0]);
        uStack_1af0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[2]);
        local_1ae8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[0]);
        uStack_1ae0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[2]);
        uStack_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[0]);
        uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[2]);
        sStack_1ab8 = right.num_time_segments;
        sStack_1ab0 = right.max_num_time_segments;
        auStack_1aa8._0_8_ = CONCAT44(right.max_time_range.upper,right.max_time_range.lower);
        auStack_1aa8._8_8_ = SUB168(auStack_1aa8,8);
        auVar63._8_8_ = 0;
        auVar63._0_8_ = auStack_1aa8._8_8_;
        auVar58 = vcmpps_avx(auVar63,auVar52,1);
        auVar54 = vinsertps_avx(auVar52,auVar63,0x50);
        auVar53 = vinsertps_avx(auVar63,auVar52,0x50);
        auVar58 = vblendvps_avx(auVar53,auVar54,auVar58);
        uVar7 = vmovlps_avx(auVar58);
        auStack_1aa8._0_8_ = SUB168(auStack_1aa8,0);
        auStack_1aa8._8_8_ = uVar7;
        this = this_01;
        local_1ac8 = BStack_1bb0;
        local_1a98 = local_1b88;
LAB_0141a0b4:
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
        this_01 = this;
      }
      else {
        this_00 = (SetMB *)((long)&blower0 + lVar29 + 0x10);
        if (iVar48 != 2) {
          if (iVar48 == 1) {
            SetMB::deterministic_order(this_00);
            splitFallback(this_01,this_00,(SetMB *)&blower1.upper,(SetMB *)&bupper0.upper);
            this = this_01;
          }
          else {
            this = this_01;
            if (iVar48 == 3) {
              SetMB::deterministic_order(this_00);
              splitByGeometry(this_01,this_00,(SetMB *)&blower1.upper,(SetMB *)&bupper0.upper);
              this = this_01;
            }
          }
          goto LAB_0141a0b4;
        }
        time_range1.lower = *(float *)((long)local_1718 + lVar29 + 8);
        time_range0.lower = local_1728[uVar49 * 0x1e + -1].lower;
        time_range1.upper = local_1728[uVar49 * 0x1e + -1].upper;
        local_1a98 = local_1728[uVar49 * 0x1e];
        time_range0.upper = time_range1.lower;
        local_1b88 = (BBox1f)operator_new(0x28);
        pMVar10 = pHVar2->device;
        BVar9 = local_1758[uVar49 * 0x1e + 1];
        *(MemoryMonitorInterface **)local_1b88 = pMVar10;
        *(undefined1 *)((long)local_1b88 + 8) = 0;
        *(long *)((long)local_1b88 + 0x10) = 0;
        *(long *)((long)local_1b88 + 0x18) = 0;
        *(long *)((long)local_1b88 + 0x20) = 0;
        lVar31 = (long)BVar9 - (long)local_1758[uVar49 * 0x1e];
        this = this_01;
        if (lVar31 != 0) {
          uVar43 = lVar31 * 0x50;
          (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,uVar43,0);
          if (uVar43 < 0x1c00000) {
            pvVar32 = alignedMalloc(uVar43,0x10);
          }
          else {
            pvVar32 = os_malloc(uVar43,(bool *)((long)local_1b88 + 8));
          }
          *(void **)((long)local_1b88 + 0x20) = pvVar32;
          *(long *)((long)local_1b88 + 0x10) = lVar31;
          *(long *)((long)local_1b88 + 0x18) = lVar31;
          this = this_01;
        }
        pvVar26 = isLeft.vSplitPos;
        vSplitMask.field_0._8_8_ = &time_range0;
        BVar9 = local_1758[uVar49 * 0x1e];
        BVar47 = local_1758[uVar49 * 0x1e + 1];
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [0] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [1] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [2] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [3] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [0] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [1] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             -INFINITY;
        right.max_time_range.lower = 0.0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        auVar58._8_4_ = 0x3f800000;
        auVar58._0_8_ = &DAT_3f8000003f800000;
        auVar58._12_4_ = 0x3f800000;
        uVar7 = vmovlps_avx(auVar58);
        right.max_time_range.upper = (float)uVar7;
        right.time_range.lower = (float)((ulong)uVar7 >> 0x20);
        right.time_range.upper = 0.0;
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
                )local_1b88;
        vSplitMask.field_0._0_8_ = local_1a98;
        if ((ulong)((long)BVar47 - (long)BVar9) < 0xc00) {
          isLeft.split = (Split *)BVar9;
          isLeft.vSplitPos = (vint *)BVar47;
          ::anon_func::anon_class_40_5_808acc65::operator()
                    ((PrimInfoMB *)&bi,(anon_class_40_5_808acc65 *)&vSplitMask,
                     (range<unsigned_long> *)&isLeft);
        }
        else {
          isLeft.vSplitPos._6_2_ = SUB82(pvVar26,6);
          isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
          tbb::detail::r1::initialize((task_group_context *)&isLeft);
          _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          vSplitPos.field_0.v[0] = (longlong)BVar47;
          vSplitPos.field_0.v[1] = (longlong)BVar9;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMB *)&bi,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                     (anon_class_16_2_ed117de8_conflict29 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&isLeft,(task_group_context *)this);
          cVar28 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
          if (cVar28 != '\0') {
            prVar37 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar37,"task cancelled");
            __cxa_throw(prVar37,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&isLeft);
        }
        this_01 = this;
        if ((long)BStack_1c80 - (long)local_1c88 !=
            (long)local_1758[uVar49 * 0x1e + 1] - (long)local_1758[uVar49 * 0x1e]) {
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _0_8_ = &time_range0;
          BStack_1c80 = (BBox1f)parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                          (*(PrimRefMB **)((long)local_1b88 + 0x20),0,
                                           (long)local_1758[uVar49 * 0x1e + 1] -
                                           (long)local_1758[uVar49 * 0x1e],0x400,
                                           (anon_class_8_1_41ce32a5 *)&right);
        }
        uVar7 = vSplitPos.field_0.v[1];
        auVar53._4_4_ = time_range0.upper;
        auVar53._0_4_ = time_range0.lower;
        auVar53._8_8_ = 0;
        auStack_1c08._4_4_ = bi.upper.field_0.m128[1];
        auStack_1c08._0_4_ = bi.upper.field_0.m128[0];
        auStack_1c08._12_4_ = bi.upper.field_0.m128[3];
        auStack_1c08._8_4_ = bi.upper.field_0.m128[2];
        local_1bf8._4_4_ = local_1cc8.i[1];
        local_1bf8._0_4_ = local_1cc8.i[0];
        local_1bf8._12_4_ = local_1cc8.i[3];
        local_1bf8._8_4_ = local_1cc8.i[2];
        aStack_1be8.m128[1] = (float)aStack_1cb8.i[1];
        aStack_1be8.m128[0] = (float)aStack_1cb8.i[0];
        aStack_1be8.m128[3] = (float)aStack_1cb8.i[3];
        aStack_1be8.m128[2] = (float)aStack_1cb8.i[2];
        local_1bd8.upper = local_1ca8.m128[1];
        local_1bd8.lower = local_1ca8.m128[0];
        sStack_1bd0 = CONCAT44(local_1ca8.m128[3],local_1ca8.m128[2]);
        sStack_1bc8 = CONCAT44(aStack_1c98.m128[1],aStack_1c98.m128[0]);
        BStack_1bc0.upper = aStack_1c98.m128[3];
        BStack_1bc0.lower = aStack_1c98.m128[2];
        sStack_1ba8 = sStack_1c78;
        sStack_1ba0 = sStack_1c70;
        blower1.upper.field_0.m128[0] = bi.lower.field_0.m128[0];
        blower1.upper.field_0.m128[1] = bi.lower.field_0.m128[1];
        blower1.upper.field_0.m128[2] = bi.lower.field_0.m128[2];
        blower1.upper.field_0.m128[3] = bi.lower.field_0.m128[3];
        local_1bb8 = local_1c88;
        BStack_1bb0 = BStack_1c80;
        auVar64._4_4_ = fStack_1c64;
        auVar64._0_4_ = local_1c68;
        auVar64._8_8_ = 0;
        auVar70._4_4_ = fStack_1c5c;
        auVar70._0_4_ = fStack_1c60;
        auVar70._8_8_ = 0;
        auVar58 = vcmpps_avx(auVar70,auVar53,1);
        auVar54 = vinsertps_avx(auVar53,auVar70,0x50);
        auVar53 = vinsertps_avx(auVar70,auVar53,0x50);
        auVar58 = vblendvps_avx(auVar53,auVar54,auVar58);
        auStack_1b98 = vmovlhps_avx(auVar64,auVar58);
        BVar9 = local_1758[uVar49 * 0x1e + 1];
        isLeft.split = (Split *)0x7f8000007f800000;
        isLeft.vSplitPos = (vint *)0x7f8000007f800000;
        isLeft.vSplitMask = (vbool *)0xff800000ff800000;
        auVar54._8_4_ = 0x3f800000;
        auVar54._0_8_ = &DAT_3f8000003f800000;
        auVar54._12_4_ = 0x3f800000;
        vmovlps_avx(auVar54);
        _reduction2 = local_1a98;
        if ((ulong)((long)BVar9 - (long)local_1758[uVar49 * 0x1e]) < 0xc00) {
          vSplitPos.field_0.v[0] = (longlong)local_1758[uVar49 * 0x1e];
          vSplitPos.field_0.v[1] = (longlong)BVar9;
          ::anon_func::anon_class_24_3_35f68c7c::operator()
                    (&right,(anon_class_24_3_35f68c7c *)&reduction2,
                     (range<unsigned_long> *)&vSplitPos);
        }
        else {
          vSplitPos.field_0.v[1]._4_1_ = 1;
          vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar7,6);
          vSplitPos.field_0.v[1]._5_1_ = 4;
          tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
          local_19f8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_19f8._8_8_ = &reduction2;
          _reduction = (code *)BVar9;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_19f8,
                     (anon_class_16_2_ed117de8_conflict30 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&vSplitPos,(task_group_context *)this_01);
          cVar28 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
          if (cVar28 != '\0') {
            prVar37 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar37,"task cancelled");
            __cxa_throw(prVar37,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          this = this_01;
          tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
          this_01 = this;
        }
        lVar31 = right.object_range._end - right.object_range._begin;
        right.object_range._begin = *(unsigned_long *)(local_1758 + uVar49 * 0x1e);
        right.object_range._end = lVar31 + right.object_range._begin;
        if (lVar31 != (long)local_1758[uVar49 * 0x1e + 1] - right.object_range._begin) {
          isLeft.split = (Split *)&time_range1;
          right.object_range._end =
               parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                         (*(PrimRefMB **)((long)local_1a98 + 0x20),right.object_range._begin,
                          (unsigned_long)local_1758[uVar49 * 0x1e + 1],0x400,
                          (anon_class_8_1_41ce32a6 *)&isLeft);
        }
        auVar55._4_4_ = time_range1.upper;
        auVar55._0_4_ = time_range1.lower;
        auVar55._8_8_ = 0;
        bupper0.upper.field_0._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        bupper0.upper.field_0._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        uStack_1b18 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                      field_0._0_8_;
        uStack_1b10 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds0.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds0.upper.field_0.m128[2]);
        local_1b08 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                              bounds1.lower.field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                              bounds1.lower.field_0.m128[0]);
        uStack_1b00 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.lower.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.lower.field_0.m128[2]);
        uStack_1af8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[0]);
        uStack_1af0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[2]);
        local_1ae8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[0]);
        uStack_1ae0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[2]);
        uStack_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[0]);
        uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[2]);
        sStack_1ab0 = right.max_num_time_segments;
        sStack_1ab8 = right.num_time_segments;
        local_1ac8.lower = (float)(undefined4)right.object_range._begin;
        local_1ac8.upper = (float)right.object_range._begin._4_4_;
        BStack_1ac0.lower = (float)(undefined4)right.object_range._end;
        BStack_1ac0.upper = (float)right.object_range._end._4_4_;
        auVar65._4_4_ = right.time_range.upper;
        auVar65._0_4_ = right.time_range.lower;
        auVar65._8_8_ = 0;
        auVar58 = vcmpps_avx(auVar65,auVar55,1);
        auVar54 = vinsertps_avx(auVar55,auVar65,0x50);
        auVar53 = vinsertps_avx(auVar65,auVar55,0x50);
        auVar58 = vblendvps_avx(auVar53,auVar54,auVar58);
        auVar66._4_4_ = right.max_time_range.upper;
        auVar66._0_4_ = right.max_time_range.lower;
        auVar66._8_8_ = 0;
        auStack_1aa8 = vmovlhps_avx(auVar66,auVar58);
      }
      auVar54 = auStack_1aa8;
      auVar58 = auStack_1b98;
      bVar50 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      findFallback((Split *)&bi,this,(SetMB *)&blower1.upper);
      uVar7 = CONCAT44(bi.upper.field_0.m128[1],bi.upper.field_0.m128[0]);
      findFallback((Split *)&bi,this,(SetMB *)&bupper0.upper);
      lVar31 = local_640;
      uVar17 = CONCAT44(bi.upper.field_0.m128[1],bi.upper.field_0.m128[0]);
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )0x0;
      pBVar39 = local_8c8[uVar49];
      if (local_1b88 == *pBVar39) {
        pBVar39[1] = (BBox1f)((long)pBVar39[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar31 * 2 + -1] = local_1b88;
        local_838[lVar31 * 2].lower = 1.4013e-45;
        local_838[lVar31 * 2].upper = 0.0;
        local_8c8[uVar49] = local_838 + lVar31 * 2 + -1;
      }
      lVar31 = local_640;
      if (local_1a98 == *pBVar39) {
        local_8c8[local_848] = pBVar39;
        pBVar39[1] = (BBox1f)((long)pBVar39[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar31 * 2 + -1] = local_1a98;
        local_838[lVar31 * 2].lower = 1.4013e-45;
        local_838[lVar31 * 2].upper = 0.0;
        local_8c8[local_848] = local_838 + lVar31 * 2 + -1;
      }
      pBVar13 = pBVar39 + 1;
      *pBVar13 = (BBox1f)((long)*pBVar13 + -1);
      if ((*pBVar13 == (BBox1f)0x0) && (BVar9 = *pBVar39, BVar9 != (BBox1f)0x0)) {
        lVar31 = *(undefined8 *)((long)BVar9 + 0x18);
        pvVar32 = *(void **)((long)BVar9 + 0x20);
        this = this_01;
        if (pvVar32 != (void *)0x0) {
          if ((ulong)(lVar31 * 0x50) < 0x1c00000) {
            alignedFree(pvVar32);
            this = this_01;
          }
          else {
            os_free(pvVar32,lVar31 * 0x50,*(bool *)((long)BVar9 + 8));
            this = this_01;
          }
        }
        if (lVar31 != 0) {
          (**(code **)**(undefined8 **)BVar9)(*(undefined8 **)BVar9,lVar31 * -0x50,1);
        }
        *(undefined8 *)((long)BVar9 + 0x10) = 0;
        *(undefined8 *)((long)BVar9 + 0x18) = 0;
        *(undefined8 *)((long)BVar9 + 0x20) = 0;
        operator_delete((void *)BVar9);
        this_01 = this;
      }
      uVar43 = local_848;
      *(undefined8 *)((long)&blower0 + lVar29) = blower1.lower.field_0._0_8_;
      *(ulong *)((long)&blower0 + lVar29 + 0x10) =
           CONCAT44(blower1.upper.field_0.m128[1],blower1.upper.field_0.m128[0]);
      *(ulong *)((long)&blower0 + lVar29 + 0x18) =
           CONCAT44(blower1.upper.field_0.m128[3],blower1.upper.field_0.m128[2]);
      ((BBox1f *)(local_17a8 + uVar49 * 0xf0))->lower = (float)auStack_1c08._0_4_;
      ((BBox1f *)(local_17a8 + uVar49 * 0xf0))->upper = (float)auStack_1c08._4_4_;
      ((BBox1f *)(auStack_1798 + lVar29 + -8))->lower = (float)auStack_1c08._8_4_;
      ((BBox1f *)(auStack_1798 + lVar29 + -8))->upper = (float)auStack_1c08._12_4_;
      ((BBox1f *)(auStack_1798 + lVar29))->lower = (float)local_1bf8._0_4_;
      ((BBox1f *)(auStack_1798 + lVar29))->upper = (float)local_1bf8._4_4_;
      ((BBox1f *)(auStack_1798 + lVar29 + 8))->lower = (float)local_1bf8._8_4_;
      ((BBox1f *)(auStack_1798 + lVar29 + 8))->upper = (float)local_1bf8._12_4_;
      ((BBox1f *)(local_1788 + uVar49 * 0xf0))->lower = (float)aStack_1be8._0_4_;
      ((BBox1f *)(local_1788 + uVar49 * 0xf0))->upper = aStack_1be8.m128[1];
      ((BBox1f *)(local_1788 + lVar29 + 8))->lower = (float)aStack_1be8._8_4_;
      ((BBox1f *)(local_1788 + lVar29 + 8))->upper = aStack_1be8.m128[3];
      *(BBox1f *)(&local_1778 + uVar49 * 0xf) = local_1bd8;
      *(size_t *)((long)&local_1778 + lVar29 + 8) = sStack_1bd0;
      *(size_t *)(local_1768 + uVar49 * 0xf0) = sStack_1bc8;
      *(BBox1f *)(local_1768 + lVar29 + 8) = BStack_1bc0;
      local_1758[uVar49 * 0x1e] = local_1bb8;
      local_1758[uVar49 * 0x1e + 1] = BStack_1bb0;
      asStack_1748[uVar49 * 0x1e] = sStack_1ba8;
      asStack_1748[uVar49 * 0x1e + 1] = sStack_1ba0;
      (&local_1738)[uVar49 * 0x1e].lower = (float)auStack_1b98._0_4_;
      (&local_1738)[uVar49 * 0x1e].upper = (float)auStack_1b98._4_4_;
      local_1728[uVar49 * 0x1e + -1].lower = (float)auStack_1b98._8_4_;
      local_1728[uVar49 * 0x1e + -1].upper = (float)auStack_1b98._12_4_;
      *(BBox1f *)&local_1728[uVar49 * 0x1e].lower = local_1b88;
      pSVar5->sah = INFINITY;
      pSVar5->dim = -1;
      *(undefined8 *)((long)local_1718 + lVar29 + 8) = 0;
      *(undefined8 *)((long)local_1718 + uVar49 * 0xf0 + 0x10) = uVar7;
      *(ulong *)((long)local_1718 + uVar49 * 0xf0 + 0x20) =
           CONCAT44(local_1cc8.i[1],local_1cc8.i[0]);
      *(ulong *)((long)local_1718 + uVar49 * 0xf0 + 0x28) =
           CONCAT44(local_1cc8.i[3],local_1cc8.i[2]);
      *(ulong *)((long)local_1718 + (uVar49 * 0x1e + -1) * 8 + 0x38) =
           CONCAT44(aStack_1cb8.i[1],aStack_1cb8.i[0]);
      *(ulong *)((long)local_1718 + uVar49 * 0xf0 + 0x38) =
           CONCAT44(aStack_1cb8.i[3],aStack_1cb8.i[2]);
      lVar29 = local_848 * 0xf0;
      *(undefined8 *)((long)&blower0 + lVar29) = bupper0.lower.field_0._0_8_;
      *(undefined8 *)((long)&blower0 + lVar29 + 0x10) = bupper0.upper.field_0._0_8_;
      *(undefined8 *)((long)&blower0 + lVar29 + 0x18) = bupper0.upper.field_0._8_8_;
      *(undefined8 *)(local_17a8 + uVar43 * 0xf0) = uStack_1b18;
      *(undefined8 *)(auStack_1798 + lVar29 + -8) = uStack_1b10;
      *(undefined8 *)(auStack_1798 + lVar29) = local_1b08;
      *(undefined8 *)(auStack_1798 + lVar29 + 8) = uStack_1b00;
      *(undefined8 *)(local_1788 + uVar43 * 0xf0) = uStack_1af8;
      *(undefined8 *)(local_1788 + lVar29 + 8) = uStack_1af0;
      *(undefined8 *)(&local_1778 + uVar43 * 0xf) = local_1ae8;
      *(undefined8 *)((long)&local_1778 + lVar29 + 8) = uStack_1ae0;
      *(undefined8 *)(local_1768 + uVar43 * 0xf0) = uStack_1ad8;
      *(undefined8 *)(local_1768 + lVar29 + 8) = uStack_1ad0;
      local_1758[uVar43 * 0x1e] = local_1ac8;
      local_1758[uVar43 * 0x1e + 1] = BStack_1ac0;
      asStack_1748[uVar43 * 0x1e] = sStack_1ab8;
      asStack_1748[uVar43 * 0x1e + 1] = sStack_1ab0;
      (&local_1738)[uVar43 * 0x1e].lower = (float)auStack_1aa8._0_4_;
      (&local_1738)[uVar43 * 0x1e].upper = (float)auStack_1aa8._4_4_;
      local_1728[uVar43 * 0x1e + -1].lower = (float)auStack_1aa8._8_4_;
      local_1728[uVar43 * 0x1e + -1].upper = (float)auStack_1aa8._12_4_;
      local_1728[uVar43 * 0x1e] = local_1a98;
      *(undefined8 *)((long)local_1718 + lVar29) = 0xffffffff7f800000;
      *(undefined8 *)((long)local_1718 + lVar29 + 8) = 0;
      *(undefined8 *)((long)local_1718 + uVar43 * 0xf0 + 0x10) = uVar17;
      *(ulong *)((long)local_1718 + uVar43 * 0xf0 + 0x20) =
           CONCAT44(local_1cc8.i[1],local_1cc8.i[0]);
      *(ulong *)((long)local_1718 + uVar43 * 0xf0 + 0x28) =
           CONCAT44(local_1cc8.i[3],local_1cc8.i[2]);
      *(ulong *)((long)local_1718 + (uVar43 * 0x1e + -1) * 8 + 0x38) =
           CONCAT44(aStack_1cb8.i[1],aStack_1cb8.i[0]);
      *(ulong *)((long)local_1718 + uVar43 * 0xf0 + 0x38) =
           CONCAT44(aStack_1cb8.i[3],aStack_1cb8.i[2]);
      local_848 = local_848 + 1;
      if ((__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&new_vector,
                     (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                      *)new_vector._M_t.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl);
      }
      uVar40 = (ulong)(byte)((byte)uVar40 | bVar50);
      auStack_1b98 = auVar58;
      auStack_1aa8 = auVar54;
    }
  } while ((uVar49 != 0xffffffffffffffff) && (local_848 < (this->cfg).branchingFactor));
  if (local_848 != 0) {
    puVar41 = &uStack_172c;
    uVar33 = local_848;
    do {
      auVar58 = vcmpps_avx(ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.lower),
                           ZEXT416(puVar41[-1]),1);
      auVar54 = vcmpps_avx(ZEXT416(*puVar41),
                           ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.upper),1);
      auVar58 = vorps_avx(auVar58,auVar54);
      uVar40 = (ulong)(byte)((byte)uVar40 | auVar58[0]);
      puVar41 = puVar41 + 0x3c;
      uVar33 = uVar33 - 1;
    } while (uVar33 != 0);
  }
  local_1de8._0_8_ = uVar40;
  if ((uVar40 & 1) == 0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar11 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar11->alloc)._M_b._M_p) {
      bupper0.lower.field_0._8_1_ = 1;
      bupper0.lower.field_0._0_8_ = pTVar11;
      MutexSys::lock(&pTVar11->mutex);
      if ((pTVar11->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar3 = &((pTVar11->alloc)._M_b._M_p)->bytesUsed;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (pTVar11->alloc1).bytesUsed + (pTVar11->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar3 = &((pTVar11->alloc)._M_b._M_p)->bytesFree;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar11->alloc0).end + (pTVar11->alloc1).end) -
             ((pTVar11->alloc0).cur + (pTVar11->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar3 = &((pTVar11->alloc)._M_b._M_p)->bytesWasted;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (pTVar11->alloc1).bytesWasted + (pTVar11->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar61 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar11->alloc0).end = auVar61._0_8_;
      (pTVar11->alloc0).allocBlockSize = auVar61._8_8_;
      (pTVar11->alloc0).bytesUsed = auVar61._16_8_;
      (pTVar11->alloc0).bytesWasted = auVar61._24_8_;
      (pTVar11->alloc0).ptr = (char *)auVar61._0_8_;
      (pTVar11->alloc0).cur = auVar61._8_8_;
      (pTVar11->alloc0).end = auVar61._16_8_;
      (pTVar11->alloc0).allocBlockSize = auVar61._24_8_;
      auVar61 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar11->alloc1).end = auVar61._0_8_;
        (pTVar11->alloc1).allocBlockSize = auVar61._8_8_;
        (pTVar11->alloc1).bytesUsed = auVar61._16_8_;
        (pTVar11->alloc1).bytesWasted = auVar61._24_8_;
        (pTVar11->alloc1).ptr = (char *)auVar61._0_8_;
        (pTVar11->alloc1).cur = auVar61._8_8_;
        (pTVar11->alloc1).end = auVar61._16_8_;
        (pTVar11->alloc1).allocBlockSize = auVar61._24_8_;
      }
      else {
        (pTVar11->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar11->alloc1).ptr = (char *)auVar61._0_8_;
        (pTVar11->alloc1).cur = auVar61._8_8_;
        (pTVar11->alloc1).end = auVar61._16_8_;
        (pTVar11->alloc1).allocBlockSize = auVar61._24_8_;
        (pTVar11->alloc1).end = auVar61._0_8_;
        (pTVar11->alloc1).allocBlockSize = auVar61._8_8_;
        (pTVar11->alloc1).bytesUsed = auVar61._16_8_;
        (pTVar11->alloc1).bytesWasted = auVar61._24_8_;
        (pTVar11->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar11->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      bi.lower.field_0.m128[0] = SUB84(pTVar11,0);
      bi.lower.field_0.m128[1] = (float)((ulong)pTVar11 >> 0x20);
      blower1.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      blower1.lower.field_0._8_1_ = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar12._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar12._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar12,(ThreadLocal2 **)&bi);
      }
      else {
        *iVar12._M_current =
             (ThreadLocal2 *)CONCAT44(bi.lower.field_0.m128[1],bi.lower.field_0.m128[0]);
        pppTVar4 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar4 = *pppTVar4 + 1;
      }
      if (blower1.lower.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)blower1.lower.field_0._0_8_);
      }
      if (bupper0.lower.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)bupper0.lower.field_0._0_8_);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar35 = (alloc.talloc0)->cur;
    uVar33 = (ulong)(-(int)sVar35 & 0xf);
    uVar40 = sVar35 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar33;
    (alloc.talloc0)->cur = uVar40;
    if ((alloc.talloc0)->end < uVar40) {
      (alloc.talloc0)->cur = sVar35;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
        (alloc.talloc0)->ptr = pcVar46;
        sVar35 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar35;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        this = this_01;
        if ((ulong)blower1.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
          (alloc.talloc0)->ptr = pcVar46;
          sVar35 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar35;
          (alloc.talloc0)->cur = 0;
          (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)blower1.lower.field_0._0_8_ <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar46 = (char *)0x0;
            this_01 = this;
            goto LAB_0141b1be;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar35;
        this_01 = this;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar33;
      pcVar46 = (alloc.talloc0)->ptr +
                (uVar40 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_0141b1be:
    uVar33 = 1;
    goto LAB_0141b1c3;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar11 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar11->alloc)._M_b._M_p) {
    bupper0.lower.field_0._8_1_ = 1;
    bupper0.lower.field_0._0_8_ = pTVar11;
    MutexSys::lock(&pTVar11->mutex);
    if ((pTVar11->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar3 = &((pTVar11->alloc)._M_b._M_p)->bytesUsed;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i +
           (pTVar11->alloc1).bytesUsed + (pTVar11->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar3 = &((pTVar11->alloc)._M_b._M_p)->bytesFree;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar11->alloc0).end + (pTVar11->alloc1).end) -
           ((pTVar11->alloc0).cur + (pTVar11->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar3 = &((pTVar11->alloc)._M_b._M_p)->bytesWasted;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i +
           (pTVar11->alloc1).bytesWasted + (pTVar11->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar61 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar11->alloc0).end = auVar61._0_8_;
    (pTVar11->alloc0).allocBlockSize = auVar61._8_8_;
    (pTVar11->alloc0).bytesUsed = auVar61._16_8_;
    (pTVar11->alloc0).bytesWasted = auVar61._24_8_;
    (pTVar11->alloc0).ptr = (char *)auVar61._0_8_;
    (pTVar11->alloc0).cur = auVar61._8_8_;
    (pTVar11->alloc0).end = auVar61._16_8_;
    (pTVar11->alloc0).allocBlockSize = auVar61._24_8_;
    auVar61 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar11->alloc1).end = auVar61._0_8_;
      (pTVar11->alloc1).allocBlockSize = auVar61._8_8_;
      (pTVar11->alloc1).bytesUsed = auVar61._16_8_;
      (pTVar11->alloc1).bytesWasted = auVar61._24_8_;
      (pTVar11->alloc1).ptr = (char *)auVar61._0_8_;
      (pTVar11->alloc1).cur = auVar61._8_8_;
      (pTVar11->alloc1).end = auVar61._16_8_;
      (pTVar11->alloc1).allocBlockSize = auVar61._24_8_;
    }
    else {
      (pTVar11->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar11->alloc1).ptr = (char *)auVar61._0_8_;
      (pTVar11->alloc1).cur = auVar61._8_8_;
      (pTVar11->alloc1).end = auVar61._16_8_;
      (pTVar11->alloc1).allocBlockSize = auVar61._24_8_;
      (pTVar11->alloc1).end = auVar61._0_8_;
      (pTVar11->alloc1).allocBlockSize = auVar61._8_8_;
      (pTVar11->alloc1).bytesUsed = auVar61._16_8_;
      (pTVar11->alloc1).bytesWasted = auVar61._24_8_;
      (pTVar11->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar11->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    bi.lower.field_0.m128[0] = SUB84(pTVar11,0);
    bi.lower.field_0.m128[1] = (float)((ulong)pTVar11 >> 0x20);
    blower1.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    blower1.lower.field_0._8_1_ = 1;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar12._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar12._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar12,(ThreadLocal2 **)&bi);
    }
    else {
      *iVar12._M_current =
           (ThreadLocal2 *)CONCAT44(bi.lower.field_0.m128[1],bi.lower.field_0.m128[0]);
      pppTVar4 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar4 = *pppTVar4 + 1;
    }
    if (blower1.lower.field_0._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)blower1.lower.field_0._0_8_);
    }
    if (bupper0.lower.field_0._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)bupper0.lower.field_0._0_8_);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar35 = (alloc.talloc0)->cur;
  uVar33 = (ulong)(-(int)sVar35 & 0xf);
  uVar40 = sVar35 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar33;
  (alloc.talloc0)->cur = uVar40;
  if ((alloc.talloc0)->end < uVar40) {
    (alloc.talloc0)->cur = sVar35;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
      pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
      (alloc.talloc0)->ptr = pcVar46;
      sVar35 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar35;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      this = this_01;
      if ((ulong)blower1.lower.field_0._0_8_ <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
        (alloc.talloc0)->ptr = pcVar46;
        sVar35 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar35;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)blower1.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar46 = (char *)0x0;
          this_01 = this;
          goto LAB_0141b118;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar35;
      this_01 = this;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar33;
    pcVar46 = (alloc.talloc0)->ptr +
              (uVar40 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_0141b118:
  pcVar46[0xe0] = '\0';
  pcVar46[0xe1] = '\0';
  pcVar46[0xe2] = -0x80;
  pcVar46[0xe3] = '\x7f';
  pcVar46[0xe4] = '\0';
  pcVar46[0xe5] = '\0';
  pcVar46[0xe6] = -0x80;
  pcVar46[0xe7] = '\x7f';
  pcVar46[0xe8] = '\0';
  pcVar46[0xe9] = '\0';
  pcVar46[0xea] = -0x80;
  pcVar46[0xeb] = '\x7f';
  pcVar46[0xec] = '\0';
  pcVar46[0xed] = '\0';
  pcVar46[0xee] = -0x80;
  pcVar46[0xef] = '\x7f';
  pcVar46[0xf0] = '\0';
  pcVar46[0xf1] = '\0';
  pcVar46[0xf2] = -0x80;
  pcVar46[0xf3] = -1;
  pcVar46[0xf4] = '\0';
  pcVar46[0xf5] = '\0';
  pcVar46[0xf6] = -0x80;
  pcVar46[0xf7] = -1;
  pcVar46[0xf8] = '\0';
  pcVar46[0xf9] = '\0';
  pcVar46[0xfa] = -0x80;
  pcVar46[0xfb] = -1;
  pcVar46[0xfc] = '\0';
  pcVar46[0xfd] = '\0';
  pcVar46[0xfe] = -0x80;
  pcVar46[0xff] = -1;
  uVar33 = 6;
LAB_0141b1c3:
  pcVar46[0x60] = '\0';
  pcVar46[0x61] = '\0';
  pcVar46[0x62] = -0x80;
  pcVar46[99] = '\x7f';
  pcVar46[100] = '\0';
  pcVar46[0x65] = '\0';
  pcVar46[0x66] = -0x80;
  pcVar46[0x67] = '\x7f';
  pcVar46[0x68] = '\0';
  pcVar46[0x69] = '\0';
  pcVar46[0x6a] = -0x80;
  pcVar46[0x6b] = '\x7f';
  pcVar46[0x6c] = '\0';
  pcVar46[0x6d] = '\0';
  pcVar46[0x6e] = -0x80;
  pcVar46[0x6f] = '\x7f';
  pcVar46[0x40] = '\0';
  pcVar46[0x41] = '\0';
  pcVar46[0x42] = -0x80;
  pcVar46[0x43] = '\x7f';
  pcVar46[0x44] = '\0';
  pcVar46[0x45] = '\0';
  pcVar46[0x46] = -0x80;
  pcVar46[0x47] = '\x7f';
  pcVar46[0x48] = '\0';
  pcVar46[0x49] = '\0';
  pcVar46[0x4a] = -0x80;
  pcVar46[0x4b] = '\x7f';
  pcVar46[0x4c] = '\0';
  pcVar46[0x4d] = '\0';
  pcVar46[0x4e] = -0x80;
  pcVar46[0x4f] = '\x7f';
  pcVar46[0x20] = '\0';
  pcVar46[0x21] = '\0';
  pcVar46[0x22] = -0x80;
  pcVar46[0x23] = '\x7f';
  pcVar46[0x24] = '\0';
  pcVar46[0x25] = '\0';
  pcVar46[0x26] = -0x80;
  pcVar46[0x27] = '\x7f';
  pcVar46[0x28] = '\0';
  pcVar46[0x29] = '\0';
  pcVar46[0x2a] = -0x80;
  pcVar46[0x2b] = '\x7f';
  pcVar46[0x2c] = '\0';
  pcVar46[0x2d] = '\0';
  pcVar46[0x2e] = -0x80;
  pcVar46[0x2f] = '\x7f';
  local_1e58._8_4_ = 0xff800000;
  local_1e58._0_8_ = 0xff800000ff800000;
  local_1e58._12_4_ = 0xff800000;
  *(undefined1 (*) [16])(pcVar46 + 0x70) = local_1e58;
  *(undefined1 (*) [16])(pcVar46 + 0x50) = local_1e58;
  *(undefined1 (*) [16])(pcVar46 + 0x30) = local_1e58;
  auVar58 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])(pcVar46 + 0x80) = ZEXT1632(auVar58);
  *(undefined1 (*) [32])(pcVar46 + 0xa0) = ZEXT1632(auVar58);
  *(undefined1 (*) [32])(pcVar46 + 0xc0) = ZEXT1632(auVar58);
  pcVar46[0] = '\b';
  pcVar46[1] = '\0';
  pcVar46[2] = '\0';
  pcVar46[3] = '\0';
  pcVar46[4] = '\0';
  pcVar46[5] = '\0';
  pcVar46[6] = '\0';
  pcVar46[7] = '\0';
  pcVar46[8] = '\b';
  pcVar46[9] = '\0';
  pcVar46[10] = '\0';
  pcVar46[0xb] = '\0';
  pcVar46[0xc] = '\0';
  pcVar46[0xd] = '\0';
  pcVar46[0xe] = '\0';
  pcVar46[0xf] = '\0';
  pcVar46[0x10] = '\b';
  pcVar46[0x11] = '\0';
  pcVar46[0x12] = '\0';
  pcVar46[0x13] = '\0';
  pcVar46[0x14] = '\0';
  pcVar46[0x15] = '\0';
  pcVar46[0x16] = '\0';
  pcVar46[0x17] = '\0';
  pcVar46[0x18] = '\b';
  pcVar46[0x19] = '\0';
  pcVar46[0x1a] = '\0';
  pcVar46[0x1b] = '\0';
  pcVar46[0x1c] = '\0';
  pcVar46[0x1d] = '\0';
  pcVar46[0x1e] = '\0';
  pcVar46[0x1f] = '\0';
  local_1e38._8_4_ = 0x7f800000;
  local_1e38._0_8_ = 0x7f8000007f800000;
  local_1e38._12_4_ = 0x7f800000;
  in_00 = (BuildRecord *)&blower0;
  if (local_848 != 0) {
    pBVar39 = &values[0].dt;
    uVar40 = 0;
    local_1e38._8_4_ = 0x7f800000;
    local_1e38._0_8_ = 0x7f8000007f800000;
    local_1e38._12_4_ = 0x7f800000;
    uStack_1e10._0_4_ = INFINITY;
    local_1e18 = (undefined1  [8])0x7f8000007f800000;
    uStack_1e10._4_4_ = INFINITY;
    local_1e58._8_4_ = 0xff800000;
    local_1e58._0_8_ = 0xff800000ff800000;
    local_1e58._12_4_ = 0xff800000;
    local_1df8._8_4_ = 0xff800000;
    local_1df8._0_8_ = 0xff800000ff800000;
    local_1df8._12_4_ = 0xff800000;
    do {
      createLargeLeaf((NodeRecordMB4D *)&blower1,this,in_00,alloc);
      pBVar39[-10].lower = (float)blower1.lower.field_0._0_4_;
      pBVar39[-10].upper = (float)blower1.lower.field_0._4_4_;
      auVar23._4_4_ = blower1.upper.field_0.m128[1];
      auVar23._0_4_ = blower1.upper.field_0.m128[0];
      auVar23._8_4_ = blower1.upper.field_0.m128[2];
      auVar23._12_4_ = blower1.upper.field_0.m128[3];
      *(undefined1 (*) [16])(pBVar39 + -8) = auVar23;
      pBVar39[-6].lower = (float)auStack_1c08._0_4_;
      pBVar39[-6].upper = (float)auStack_1c08._4_4_;
      pBVar39[-5].lower = (float)auStack_1c08._8_4_;
      pBVar39[-5].upper = (float)auStack_1c08._12_4_;
      pBVar39[-4].lower = (float)local_1bf8._0_4_;
      pBVar39[-4].upper = (float)local_1bf8._4_4_;
      pBVar39[-3].lower = (float)local_1bf8._8_4_;
      pBVar39[-3].upper = (float)local_1bf8._12_4_;
      pBVar39[-2].lower = (float)aStack_1be8._0_4_;
      pBVar39[-2].upper = aStack_1be8.m128[1];
      pBVar39[-1].lower = (float)aStack_1be8._8_4_;
      pBVar39[-1].upper = aStack_1be8.m128[3];
      *pBVar39 = local_1bd8;
      local_1e58 = vmaxps_avx(local_1e58,*(undefined1 (*) [16])(pBVar39 + -6));
      _local_1e18 = vminps_avx(_local_1e18,*(undefined1 (*) [16])(pBVar39 + -4));
      local_1e38 = vminps_avx(local_1e38,auVar23);
      local_1df8 = vmaxps_avx(local_1df8,*(undefined1 (*) [16])(pBVar39 + -2));
      uVar40 = uVar40 + 1;
      pBVar39 = pBVar39 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
    } while (uVar40 < local_848);
  }
  uVar33 = uVar33 | (ulong)pcVar46;
  if (((uint)uVar33 & 0xf) == 1) {
    if (local_848 != 0) {
      uVar49 = (ulong)pcVar46 & 0xfffffffffffffff0;
      pfVar34 = &values[0].dt.upper;
      uVar40 = 0;
      auVar71._8_4_ = 0x7f7fffff;
      auVar71._0_8_ = 0x7f7fffff7f7fffff;
      auVar71._12_4_ = 0x7f7fffff;
      auVar76._8_4_ = 0xff7fffff;
      auVar76._0_8_ = 0xff7fffffff7fffff;
      auVar76._12_4_ = 0xff7fffff;
      auVar77._8_4_ = 0x7fffffff;
      auVar77._0_8_ = 0x7fffffff7fffffff;
      auVar77._12_4_ = 0x7fffffff;
      do {
        *(undefined8 *)(uVar49 + uVar40 * 8) = *(undefined8 *)(pfVar34 + -0x15);
        fVar6 = ((BBox1f *)(pfVar34 + -1))->lower;
        fVar81 = 1.0 / (*pfVar34 - fVar6);
        fVar79 = -fVar6 * fVar81;
        auVar58 = vshufps_avx(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79),0);
        auVar54 = vshufps_avx(ZEXT416((uint)(1.0 - fVar79)),ZEXT416((uint)(1.0 - fVar79)),0);
        auVar97._0_4_ = pfVar34[-9] * auVar58._0_4_ + pfVar34[-0x11] * auVar54._0_4_;
        auVar97._4_4_ = pfVar34[-8] * auVar58._4_4_ + pfVar34[-0x10] * auVar54._4_4_;
        auVar97._8_4_ = pfVar34[-7] * auVar58._8_4_ + pfVar34[-0xf] * auVar54._8_4_;
        auVar97._12_4_ = pfVar34[-6] * auVar58._12_4_ + pfVar34[-0xe] * auVar54._12_4_;
        auVar88._0_4_ = pfVar34[-5] * auVar58._0_4_ + pfVar34[-0xd] * auVar54._0_4_;
        auVar88._4_4_ = pfVar34[-4] * auVar58._4_4_ + pfVar34[-0xc] * auVar54._4_4_;
        auVar88._8_4_ = pfVar34[-3] * auVar58._8_4_ + pfVar34[-0xb] * auVar54._8_4_;
        auVar88._12_4_ = pfVar34[-2] * auVar58._12_4_ + pfVar34[-10] * auVar54._12_4_;
        fVar81 = (1.0 - fVar6) * fVar81;
        auVar58 = vshufps_avx(ZEXT416((uint)fVar81),ZEXT416((uint)fVar81),0);
        auVar54 = vshufps_avx(ZEXT416((uint)(1.0 - fVar81)),ZEXT416((uint)(1.0 - fVar81)),0);
        auVar90._0_4_ = pfVar34[-9] * auVar58._0_4_ + pfVar34[-0x11] * auVar54._0_4_;
        auVar90._4_4_ = pfVar34[-8] * auVar58._4_4_ + pfVar34[-0x10] * auVar54._4_4_;
        auVar90._8_4_ = pfVar34[-7] * auVar58._8_4_ + pfVar34[-0xf] * auVar54._8_4_;
        auVar90._12_4_ = pfVar34[-6] * auVar58._12_4_ + pfVar34[-0xe] * auVar54._12_4_;
        auVar82._0_4_ = pfVar34[-5] * auVar58._0_4_ + pfVar34[-0xd] * auVar54._0_4_;
        auVar82._4_4_ = pfVar34[-4] * auVar58._4_4_ + pfVar34[-0xc] * auVar54._4_4_;
        auVar82._8_4_ = pfVar34[-3] * auVar58._8_4_ + pfVar34[-0xb] * auVar54._8_4_;
        auVar82._12_4_ = pfVar34[-2] * auVar58._12_4_ + pfVar34[-10] * auVar54._12_4_;
        auVar74 = vminps_avx(auVar97,auVar71);
        auVar54 = vmaxps_avx(auVar88,auVar76);
        auVar64 = vminps_avx(auVar90,auVar71);
        auVar53 = vmaxps_avx(auVar82,auVar76);
        auVar58 = vandps_avx(auVar74,auVar77);
        auVar95._0_4_ = auVar58._0_4_ * 4.7683716e-07;
        auVar95._4_4_ = auVar58._4_4_ * 4.7683716e-07;
        auVar95._8_4_ = auVar58._8_4_ * 4.7683716e-07;
        auVar95._12_4_ = auVar58._12_4_ * 4.7683716e-07;
        auVar74 = vsubps_avx(auVar74,auVar95);
        auVar58 = vandps_avx(auVar54,auVar77);
        auVar89._0_4_ = auVar54._0_4_ + auVar58._0_4_ * 4.7683716e-07;
        auVar89._4_4_ = auVar54._4_4_ + auVar58._4_4_ * 4.7683716e-07;
        auVar89._8_4_ = auVar54._8_4_ + auVar58._8_4_ * 4.7683716e-07;
        auVar89._12_4_ = auVar54._12_4_ + auVar58._12_4_ * 4.7683716e-07;
        auVar58 = vandps_avx(auVar64,auVar77);
        auVar96._0_4_ = auVar58._0_4_ * 4.7683716e-07;
        auVar96._4_4_ = auVar58._4_4_ * 4.7683716e-07;
        auVar96._8_4_ = auVar58._8_4_ * 4.7683716e-07;
        auVar96._12_4_ = auVar58._12_4_ * 4.7683716e-07;
        auVar54 = vsubps_avx(auVar64,auVar96);
        auVar58 = vandps_avx(auVar53,auVar77);
        *(int *)(uVar49 + 0x20 + uVar40 * 4) = auVar74._0_4_;
        uVar8 = vextractps_avx(auVar74,1);
        *(undefined4 *)(uVar49 + 0x40 + uVar40 * 4) = uVar8;
        auVar83._0_4_ = auVar58._0_4_ * 4.7683716e-07 + auVar53._0_4_;
        auVar83._4_4_ = auVar58._4_4_ * 4.7683716e-07 + auVar53._4_4_;
        auVar83._8_4_ = auVar58._8_4_ * 4.7683716e-07 + auVar53._8_4_;
        auVar83._12_4_ = auVar58._12_4_ * 4.7683716e-07 + auVar53._12_4_;
        uVar8 = vextractps_avx(auVar74,2);
        *(undefined4 *)(uVar49 + 0x60 + uVar40 * 4) = uVar8;
        *(float *)(uVar49 + 0x30 + uVar40 * 4) = auVar89._0_4_;
        uVar8 = vextractps_avx(auVar89,1);
        *(undefined4 *)(uVar49 + 0x50 + uVar40 * 4) = uVar8;
        auVar58 = vsubps_avx(auVar54,auVar74);
        uVar8 = vextractps_avx(auVar89,2);
        *(undefined4 *)(uVar49 + 0x70 + uVar40 * 4) = uVar8;
        *(int *)(uVar49 + 0x80 + uVar40 * 4) = auVar58._0_4_;
        uVar8 = vextractps_avx(auVar58,1);
        *(undefined4 *)(uVar49 + 0xa0 + uVar40 * 4) = uVar8;
        auVar54 = vsubps_avx(auVar83,auVar89);
        uVar8 = vextractps_avx(auVar58,2);
        *(undefined4 *)(uVar49 + 0xc0 + uVar40 * 4) = uVar8;
        *(int *)(uVar49 + 0x90 + uVar40 * 4) = auVar54._0_4_;
        uVar8 = vextractps_avx(auVar54,1);
        *(undefined4 *)(uVar49 + 0xb0 + uVar40 * 4) = uVar8;
        uVar8 = vextractps_avx(auVar54,2);
        *(undefined4 *)(uVar49 + 0xd0 + uVar40 * 4) = uVar8;
        uVar40 = uVar40 + 1;
        pfVar34 = pfVar34 + 0x18;
      } while (local_848 != uVar40);
    }
  }
  else {
    BuilderT<embree::NodeRefPtr<4>,embree::avx::RecalculatePrimRef<embree::UserGeometry>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::avx::CreateMSMBlurLeaf<4,embree::UserGeometry,embree::Object>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  BVar47 = BStack_1860;
  BVar9 = local_1868;
  if ((local_1de8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    (__return_storage_ptr__->ref).ptr = uVar33;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1e38._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1e38._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1e58._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1e58._8_8_;
    *(undefined1 (*) [8])&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1e18;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         uStack_1e10;
  }
  else {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)&local_18c8;
    bupper0.lower.field_0._0_8_ = 0x7f8000007f800000;
    bupper0.lower.field_0.m128[2] = INFINITY;
    bupper0.lower.field_0.m128[3] = INFINITY;
    bupper0.upper.field_0._0_8_ = 0xff800000ff800000;
    bupper0.upper.field_0._8_8_ = 0xff800000ff800000;
    if ((ulong)((long)BStack_1860 - (long)local_1868) < 0xc00) {
      blower1.lower.field_0._0_4_ = local_1868.lower;
      blower1.lower.field_0._4_4_ = local_1868.upper;
      blower1.lower.field_0._8_4_ = BStack_1860.lower;
      blower1.lower.field_0._12_4_ = BStack_1860.upper;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&bi,(anon_class_16_2_aeee9775 *)&vSplitPos,
                 (range<unsigned_long> *)&blower1);
    }
    else {
      blower1.lower.field_0._12_2_ = 0x401;
      tbb::detail::r1::initialize((task_group_context *)&blower1);
      BVar27 = BStack_1860;
      BVar20 = local_1868;
      BStack_1860.lower = BVar47.lower;
      BStack_1860.upper = BVar47.upper;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_4_ =
           BStack_1860.lower;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._4_4_ =
           BStack_1860.upper;
      local_1868.lower = BVar9.lower;
      local_1868.upper = BVar9.upper;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_4_ =
           local_1868.lower;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._12_4_ =
           local_1868.upper;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      local_1868 = BVar20;
      BStack_1860 = BVar27;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::UserGeometry>>(embree::avx::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::UserGeometry>>(embree::avx::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::UserGeometry>>(embree::avx::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::UserGeometry>>(embree::avx::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::UserGeometry>>(embree::avx::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&bi,(d1 *)&right,(blocked_range<unsigned_long> *)&bupper0,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,
                 (anon_class_1_0_00000001 *)&blower1,(task_group_context *)this_01);
      cVar28 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&blower1);
      if (cVar28 != '\0') {
        prVar37 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar37,"task cancelled");
        __cxa_throw(prVar37,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&blower1);
    }
    (__return_storage_ptr__->ref).ptr = uVar33;
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 =
         CONCAT44(bi.lower.field_0.m128[1],bi.lower.field_0.m128[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         CONCAT44(bi.lower.field_0.m128[3],bi.lower.field_0.m128[2]);
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         CONCAT44(bi.upper.field_0.m128[1],bi.upper.field_0.m128[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         CONCAT44(bi.upper.field_0.m128[3],bi.upper.field_0.m128[2]);
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 =
         CONCAT44(local_1cc8.i[1],local_1cc8.i[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(local_1cc8.i[3],local_1cc8.i[2]);
    local_1df8._0_8_ = CONCAT44(aStack_1cb8.i[1],aStack_1cb8.i[0]);
    local_1df8._8_8_ = CONCAT44(aStack_1cb8.i[3],aStack_1cb8.i[2]);
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1df8._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1df8._8_8_;
  __return_storage_ptr__->dt = BStack_1840;
  if (local_848 == 0) {
    return __return_storage_ptr__;
  }
  uVar33 = 0;
  do {
    pBVar13 = local_8c8[uVar33];
    pBVar39 = pBVar13 + 1;
    *pBVar39 = (BBox1f)((long)*pBVar39 + -1);
    if ((*pBVar39 == (BBox1f)0x0) && (BVar9 = *pBVar13, BVar9 != (BBox1f)0x0)) {
      lVar29 = *(undefined8 *)((long)BVar9 + 0x18);
      pvVar32 = *(void **)((long)BVar9 + 0x20);
      if (pvVar32 != (void *)0x0) {
        if ((ulong)(lVar29 * 0x50) < 0x1c00000) {
          alignedFree(pvVar32);
        }
        else {
          os_free(pvVar32,lVar29 * 0x50,*(bool *)((long)BVar9 + 8));
        }
      }
      if (lVar29 != 0) {
        (**(code **)**(undefined8 **)BVar9)(*(undefined8 **)BVar9,lVar29 * -0x50,1);
      }
      *(undefined8 *)((long)BVar9 + 0x10) = 0;
      *(undefined8 *)((long)BVar9 + 0x18) = 0;
      *(undefined8 *)((long)BVar9 + 0x20) = 0;
      operator_delete((void *)BVar9);
    }
    uVar33 = uVar33 + 1;
  } while (uVar33 < local_848);
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }